

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_99(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  QPDFObjectHandle qtest;
  long *local_70;
  long local_68;
  long local_60 [2];
  undefined1 local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  QPDF::getRoot();
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/QTest","");
  QPDFObjectHandle::getKey(local_40);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  iVar3 = 0;
  while( true ) {
    iVar1 = QPDFObjectHandle::getArrayNItems();
    if (iVar1 <= iVar3) break;
    QPDFObjectHandle::getArrayItem((int)local_50);
    QPDFObjectHandle::unparseResolved_abi_cxx11_();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_70,local_68);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    iVar3 = iVar3 + 1;
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

static void
test_99(QPDF& pdf, char const* arg2)
{
    // Designed for no-space-compressed-object.pdf
    QPDFObjectHandle qtest = pdf.getRoot().getKey("/QTest");
    for (int i = 0; i < qtest.getArrayNItems(); ++i) {
        std::cout << qtest.getArrayItem(i).unparseResolved() << std::endl;
    }
}